

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O3

int Bmc_EcoSolve(sat_solver *pSat,int Root,Vec_Int_t *vVars)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  Vec_Int_t *p;
  lit *begin;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int pLits [2];
  uint local_3c;
  uint local_38;
  uint local_34;
  
  iVar4 = vVars->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar5 = iVar4;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    begin = (lit *)0x0;
  }
  else {
    begin = (lit *)malloc((long)iVar5 << 2);
  }
  p->pArray = begin;
  iVar4 = sat_solver_nvars(pSat);
  sat_solver_setnvars(pSat,iVar4 + 1);
  if ((Root < 0) || (local_3c = Root * 2, iVar4 < 0)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf1,"int Abc_Var2Lit(int, int)");
  }
  local_38 = iVar4 * 2;
  uVar7 = 0;
  do {
    iVar4 = sat_solver_solve(pSat,(lit *)&local_3c,(lit *)&local_34,1000000,0,0,0);
    if (iVar4 != 1) {
      if (iVar4 == -1) {
        iVar5 = 1;
      }
      else {
        iVar5 = -1;
        if (iVar4 != 0) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                        ,0x9b,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
        }
      }
LAB_00536043:
      if (begin != (lit *)0x0) {
        free(begin);
      }
      free(p);
      return iVar5;
    }
    p->nSize = 0;
    if ((int)local_3c < 0) {
LAB_005360c6:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf4,"int Abc_LitNot(int)");
    }
    Vec_IntPush(p,local_3c ^ 1);
    if (0 < vVars->nSize) {
      lVar6 = 0;
      do {
        iVar4 = vVars->pArray[lVar6];
        if (((long)iVar4 < 0) || (pSat->size <= iVar4)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0xd5,"int sat_solver_var_literal(sat_solver *, int)");
        }
        Vec_IntPush(p,(uint)(pSat->model[iVar4] != 1) + iVar4 * 2);
        lVar6 = lVar6 + 1;
      } while (lVar6 < vVars->nSize);
    }
    begin = p->pArray;
    iVar4 = sat_solver_solve(pSat,begin,begin + p->nSize,1000000,0,0,0);
    if (iVar4 != -1) {
      if (iVar4 == 0) {
        iVar5 = -1;
      }
      else {
        iVar5 = 0;
        if (iVar4 != 1) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                        ,0xa7,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
        }
      }
      goto LAB_00536043;
    }
    uVar1 = (pSat->conf_final).size;
    piVar2 = (pSat->conf_final).ptr;
    p->nSize = 0;
    if ((int)local_38 < 0) goto LAB_005360c6;
    Vec_IntPush(p,local_38 ^ 1);
    local_34 = uVar7;
    printf("Cube %d : ",(ulong)uVar7);
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        uVar7 = piVar2[uVar8];
        if (uVar7 != local_3c) {
          Vec_IntPush(p,uVar7);
          uVar7 = piVar2[uVar8];
          if ((int)uVar7 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          if ((long)vVars->nSize < 1) {
LAB_00536069:
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                          ,0xb2,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
          }
          lVar6 = 0;
          while (vVars->pArray[lVar6] != uVar7 >> 1) {
            lVar6 = lVar6 + 1;
            if (vVars->nSize == lVar6) goto LAB_00536069;
          }
          pcVar3 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          if ((uVar7 & 1) == 0) {
            pcVar3 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          }
          printf("%s%d ",pcVar3 + 0x4a);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar1);
    }
    putchar(10);
    begin = p->pArray;
    iVar4 = sat_solver_addclause(pSat,begin,begin + p->nSize);
    uVar7 = local_34 + 1;
    if (iVar4 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xb7,"int Bmc_EcoSolve(sat_solver *, int, Vec_Int_t *)");
    }
  } while( true );
}

Assistant:

int Bmc_EcoSolve( sat_solver * pSat, int Root, Vec_Int_t * vVars )
{
    int nBTLimit = 1000000;
    Vec_Int_t * vLits   = Vec_IntAlloc( Vec_IntSize(vVars) );
    int status, i, Div, iVar, nFinal, * pFinal, nIter = 0, RetValue = 0;
    int pLits[2], nVars = sat_solver_nvars( pSat );
    sat_solver_setnvars( pSat, nVars + 1 );
    pLits[0] = Abc_Var2Lit( Root, 0 );  // F = 1
    pLits[1] = Abc_Var2Lit( nVars, 0 ); // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            { RetValue = -1; break; }
        if ( status == l_False )
            { RetValue = 1; break; }
        assert( status == l_True );
        // collect divisor literals
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( vVars, Div, i )
            Vec_IntPush( vLits, sat_solver_var_literal(pSat, Div) );
        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            { RetValue = -1; break; }
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        printf( "Cube %d : ", nIter );
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( vLits, pFinal[i] );
            iVar = Vec_IntFind( vVars, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            printf( "%s%d ", Abc_LitIsCompl(pFinal[i]) ? "+":"-", iVar );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
        assert( status );
        nIter++;
    }
//    assert( status == l_True );
    Vec_IntFree( vLits );
    return RetValue;
}